

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDFacePtr ON_SubDFace::FromVertices(ON_SubDVertex **vertex_list,size_t vertex_count)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  ON_SubDFace *pOVar4;
  ON_SubDEdgePtr OVar5;
  undefined8 *memblock;
  ON_SubDVertex *pOVar6;
  ON_SubDEdgePtr *pOVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ON_SubDEdge *this;
  ON_SubDFace *pOVar12;
  ON_SubDVertex *pOVar13;
  ON_SubDFacePtr *pOVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ON_SubDFace *candiates4 [4];
  undefined8 local_58 [5];
  
  if (vertex_list == (ON_SubDVertex **)0x0 || vertex_count - 0xfff1 < 0xffffffffffff0012) {
    return (ON_SubDFacePtr)0;
  }
  uVar17 = 0;
  memblock = (undefined8 *)0x0;
  pOVar13 = *vertex_list;
  uVar3 = 0;
  do {
    pOVar12 = (ON_SubDFace *)0x0;
    uVar10 = (uint)vertex_count;
    if (uVar3 == uVar10) goto LAB_005cbbb8;
    uVar1 = uVar3 + 1;
    pOVar4 = (ON_SubDFace *)(ulong)uVar1;
    if (uVar1 == uVar10) {
      pOVar4 = pOVar12;
    }
    pOVar6 = vertex_list[(long)pOVar4];
    OVar5 = ON_SubDEdge::FromVertices(pOVar13,pOVar6);
    this = (ON_SubDEdge *)(OVar5.m_ptr & 0xfffffffffffffff8);
    if (this == (ON_SubDEdge *)0x0) {
LAB_005cbbb6:
      pOVar12 = (ON_SubDFace *)0x0;
      goto LAB_005cbbb8;
    }
    uVar2 = this->m_face_count;
    uVar11 = (ulong)uVar2;
    if (uVar11 == 0) goto LAB_005cbbb6;
    if (uVar3 == 0) {
      memblock = local_58;
      if (4 < uVar2) {
        memblock = (undefined8 *)onmalloc((ulong)uVar2 << 3);
        uVar11 = (ulong)this->m_face_count;
        if (this->m_face_count == 0) goto LAB_005cbb90;
      }
      lVar8 = -0x10;
      uVar16 = 0;
      do {
        if (uVar16 < 2) {
          pOVar14 = this->m_face2 + uVar16;
        }
        else {
          pOVar14 = (ON_SubDFacePtr *)((long)&this->m_facex->m_ptr + lVar8);
        }
        uVar9 = pOVar14->m_ptr & 0xfffffffffffffff8;
        if ((uVar9 != 0) && (*(ushort *)(uVar9 + 0x9c) == vertex_count)) {
          uVar15 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
          memblock[uVar15] = uVar9;
        }
        uVar16 = uVar16 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar11 != uVar16);
    }
    else {
      if (uVar17 == 0) goto LAB_005cbbb6;
      uVar16 = (ulong)uVar17;
      uVar11 = 0;
      uVar17 = 0;
      do {
        pOVar12 = (ON_SubDFace *)memblock[uVar11];
        uVar3 = ON_SubDEdge::FaceArrayIndex(this,pOVar12);
        if (uVar3 != 0xffffffff) {
          uVar9 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
          memblock[uVar9] = pOVar12;
        }
        uVar11 = uVar11 + 1;
      } while (uVar16 != uVar11);
    }
LAB_005cbb90:
    pOVar12 = (ON_SubDFace *)0x0;
    if (uVar17 == 0) goto LAB_005cbbb8;
    pOVar13 = pOVar6;
    uVar3 = uVar1;
  } while (uVar17 != 1);
  pOVar12 = (ON_SubDFace *)*memblock;
LAB_005cbbb8:
  if (memblock != local_58 && memblock != (undefined8 *)0x0) {
    onfree(memblock);
  }
  if (pOVar12 == (ON_SubDFace *)0x0) {
    return (ON_SubDFacePtr)0;
  }
  uVar3 = VertexIndex(pOVar12,*vertex_list);
  if (uVar10 <= uVar3) {
    return (ON_SubDFacePtr)0;
  }
  uVar11 = 0;
  if (uVar3 + 1 != uVar10) {
    uVar11 = (ulong)(uVar3 + 1);
  }
  if ((uint)uVar11 < 4) {
    pOVar7 = pOVar12->m_edge4 + uVar11;
LAB_005cbc30:
    uVar11 = pOVar7->m_ptr & 0xfffffffffffffff8;
    if (uVar11 != 0) {
      pOVar13 = *(ON_SubDVertex **)(uVar11 + 0x80 + (ulong)((uint)pOVar7->m_ptr & 1) * 8);
      goto LAB_005cbc4b;
    }
  }
  else if ((uint)uVar11 < (uint)pOVar12->m_edge_count) {
    pOVar7 = pOVar12->m_edgex + (uVar11 - 4);
    goto LAB_005cbc30;
  }
  pOVar13 = (ON_SubDVertex *)0x0;
LAB_005cbc4b:
  if (vertex_list[1] == pOVar13) {
    if (2 < vertex_count) {
      uVar11 = 3;
      if (3 < uVar10) {
        uVar11 = vertex_count & 0xffffffff;
      }
      uVar16 = 2;
      do {
        uVar9 = (ulong)(uVar3 + (int)uVar16) % (vertex_count & 0xffffffff);
        if ((uint)uVar9 < 4) {
          pOVar7 = pOVar12->m_edge4 + uVar9;
LAB_005cbd38:
          uVar9 = pOVar7->m_ptr & 0xfffffffffffffff8;
          if (uVar9 == 0) goto LAB_005cbd51;
          pOVar6 = *(ON_SubDVertex **)(uVar9 + 0x80 + (ulong)((uint)pOVar7->m_ptr & 1) * 8);
        }
        else {
          if ((uint)uVar9 < (uint)pOVar12->m_edge_count) {
            pOVar7 = pOVar12->m_edgex + (uVar9 - 4);
            goto LAB_005cbd38;
          }
LAB_005cbd51:
          pOVar6 = (ON_SubDVertex *)0x0;
        }
        if (vertex_list[uVar16] != pOVar6) {
          return (ON_SubDFacePtr)0;
        }
        uVar16 = uVar16 + 1;
      } while (uVar11 != uVar16);
    }
  }
  else if (1 < vertex_count) {
    uVar11 = 2;
    if (2 < uVar10) {
      uVar11 = vertex_count & 0xffffffff;
    }
    uVar3 = uVar3 + uVar10;
    uVar16 = 1;
    do {
      uVar3 = uVar3 - 1;
      uVar9 = (ulong)uVar3 % (vertex_count & 0xffffffff);
      if ((uint)uVar9 < 4) {
        pOVar7 = pOVar12->m_edge4 + uVar9;
LAB_005cbcb2:
        uVar9 = pOVar7->m_ptr & 0xfffffffffffffff8;
        if (uVar9 == 0) goto LAB_005cbccb;
        pOVar6 = *(ON_SubDVertex **)(uVar9 + 0x80 + (ulong)((uint)pOVar7->m_ptr & 1) * 8);
      }
      else {
        if ((uint)uVar9 < (uint)pOVar12->m_edge_count) {
          pOVar7 = pOVar12->m_edgex + (uVar9 - 4);
          goto LAB_005cbcb2;
        }
LAB_005cbccb:
        pOVar6 = (ON_SubDVertex *)0x0;
      }
      if (vertex_list[uVar16] != pOVar6) {
        return (ON_SubDFacePtr)0;
      }
      uVar16 = uVar16 + 1;
    } while (uVar11 != uVar16);
  }
  return (ON_SubDFacePtr)((ulong)(vertex_list[1] != pOVar13) | (ulong)pOVar12);
}

Assistant:

const ON_SubDFacePtr ON_SubDFace::FromVertices(const ON_SubDVertex* const* vertex_list, size_t vertex_count)
{
  if (nullptr == vertex_list || vertex_count < 3 || vertex_count > ON_SubDFace::MaximumEdgeCount)
    return ON_SubDFacePtr::Null;

  const ON_SubDFace* candiates4[4];
  const ON_SubDFace** candidates = nullptr;
  unsigned candidate_count = 0;
  const ON_SubDFace* f = nullptr;

  const unsigned unsigned_vertex_count = (unsigned)vertex_count;
  if (unsigned_vertex_count < 3)
    return ON_SubDFacePtr::Null;
  const ON_SubDVertex* v[2] = { nullptr,vertex_list[0] };
  for (unsigned fei = 0; fei < unsigned_vertex_count; ++fei)
  {
    v[0] = v[1];
    v[1] = vertex_list[(fei + 1) % unsigned_vertex_count];
    const ON_SubDEdge* e = ON_SubDEdge::FromVertices(v[0], v[1]).Edge();
    if (nullptr == e || e->m_face_count <= 0)
      candidate_count = 0;
    else if (0 == fei)
    {
      candidates = (e->m_face_count <= 4) ? candiates4 : ((const ON_SubDFace**)onmalloc(e->m_face_count * sizeof(candidates[0])));
      for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
      {
        const ON_SubDFace* ef = e->Face(efi);
        if (nullptr != ef && unsigned_vertex_count == ef->EdgeCount())
          candidates[candidate_count++] = ef;
      }
    }
    else
    {
      unsigned c = 0;
      for (unsigned i = 0; i < candidate_count; ++i)
      {
        if (e->FaceArrayIndex(candidates[i]) < ON_UNSET_UINT_INDEX)
          candidates[c++] = candidates[i];
      }
      candidate_count = c;
    }

    if (0 == candidate_count)
      break;
    if (1 == candidate_count)
    {
      f = candidates[0];
      break;
    }
  }

  if (nullptr != candidates && candidates != candiates4)
    onfree(candidates);

  if (nullptr == f)
    return ON_SubDFacePtr::Null;

  const unsigned fvi0 = f->VertexIndex(vertex_list[0]);
  if (fvi0 >= unsigned_vertex_count)
    return ON_SubDFacePtr::Null;

  const ON__UINT_PTR dir = (vertex_list[1] == f->Vertex((fvi0 + 1) % unsigned_vertex_count)) ? 0 : 1;
  if (0 == dir)
  {
    for (unsigned fvi = 2; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  else
  {
    for (unsigned fvi = 1; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + unsigned_vertex_count - fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  return ON_SubDFacePtr::Create(f, dir);
}